

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Truck.cpp
# Opt level: O2

string * __thiscall Truck::getPlate_abi_cxx11_(string *__return_storage_ptr__,Truck *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->plate);
  return __return_storage_ptr__;
}

Assistant:

string Truck::getPlate() const {
    return plate;
}